

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O1

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::tiles(vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>
                    *__return_storage_ptr__,LngLatBbox *llbbox,int *zoom)

{
  pointer *ppTVar1;
  double dVar2;
  iterator __position;
  LngLatBbox *pLVar3;
  int *piVar4;
  pointer piVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  pointer pLVar9;
  ulong uVar10;
  pointer piVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Tile TVar14;
  Tile TVar15;
  vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> bboxes;
  vector<int,_std::allocator<int>_> x;
  vector<int,_std::allocator<int>_> y;
  double n;
  double e;
  double s;
  double w;
  vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> local_c8;
  LngLatBbox local_b0;
  Tile local_8c;
  vector<int,_std::allocator<int>_> local_80;
  LngLatBbox *local_68;
  LngLatBbox *local_60;
  int *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_c8.super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
  _M_impl.super__Vector_impl_data._M_start = (LngLatBbox *)0x0;
  local_c8.super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
  _M_impl.super__Vector_impl_data._M_finish = (LngLatBbox *)0x0;
  local_c8.super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (LngLatBbox *)0x0;
  if (llbbox->west <= llbbox->east) {
    std::vector<mercatortile::LngLatBbox,std::allocator<mercatortile::LngLatBbox>>::
    _M_realloc_insert<mercatortile::LngLatBbox_const&>
              ((vector<mercatortile::LngLatBbox,std::allocator<mercatortile::LngLatBbox>> *)
               &local_c8,(iterator)0x0,llbbox);
  }
  else {
    local_b0.west = -180.0;
    local_b0.south = llbbox->south;
    local_b0.north = llbbox->north;
    local_b0.east = llbbox->east;
    std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::
    _M_realloc_insert<mercatortile::LngLatBbox>(&local_c8,(iterator)0x0,&local_b0);
    local_b0.west = llbbox->west;
    local_b0.south = llbbox->south;
    local_b0.east = 180.0;
    local_b0.north = llbbox->north;
    if (local_c8.
        super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_c8.
        super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::
      _M_realloc_insert<mercatortile::LngLatBbox>
                (&local_c8,
                 (iterator)
                 local_c8.
                 super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_b0);
    }
    else {
      local_b0.west._4_4_ = (undefined4)((ulong)local_b0.west >> 0x20);
      local_b0.south._4_4_ = (undefined4)((ulong)local_b0.south >> 0x20);
      local_b0.east = 180.0;
      (local_c8.
       super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
       _M_impl.super__Vector_impl_data._M_finish)->east = 180.0;
      (local_c8.
       super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
       _M_impl.super__Vector_impl_data._M_finish)->north = local_b0.north;
      *(undefined4 *)
       &(local_c8.
         super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
         _M_impl.super__Vector_impl_data._M_finish)->west = local_b0.west._0_4_;
      *(undefined4 *)
       ((long)&(local_c8.
                super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                ._M_impl.super__Vector_impl_data._M_finish)->west + 4) = local_b0.west._4_4_;
      *(undefined4 *)
       &(local_c8.
         super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
         _M_impl.super__Vector_impl_data._M_finish)->south = local_b0.south._0_4_;
      *(undefined4 *)
       ((long)&(local_c8.
                super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                ._M_impl.super__Vector_impl_data._M_finish)->south + 4) = local_b0.south._4_4_;
      local_c8.
      super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_c8.
           super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = local_c8.
             super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pLVar9 = local_c8.
           super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_c8.
      super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      dVar2 = pLVar9->west;
      uVar12 = SUB84(dVar2,0);
      uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
      local_40 = pLVar9->south;
      local_48 = pLVar9->east;
      local_50 = pLVar9->north;
      if (dVar2 <= -180.0) {
        uVar12 = 0;
        uVar13 = 0xc0668000;
      }
      local_38 = (double)CONCAT44(uVar13,uVar12);
      if (local_40 <= -85.051129) {
        local_40 = -85.051129;
      }
      if (180.0 <= local_48) {
        local_48 = 180.0;
      }
      if (85.051129 <= local_50) {
        local_50 = 85.051129;
      }
      TVar14 = tile(&local_38,&local_40,zoom);
      local_60 = pLVar9;
      TVar15 = tile(&local_48,&local_50,zoom);
      uVar10 = 0;
      if (0 < TVar14.x) {
        uVar10 = TVar14._0_8_ & 0xffffffff;
      }
      uVar7 = TVar15._0_8_ >> 0x20;
      if (TVar15.y == 0 || (long)TVar15._0_8_ < 0) {
        uVar7 = 0;
      }
      iVar8 = TVar15.x + 1;
      dVar2 = ldexp(1.0,*zoom);
      iVar6 = (int)dVar2;
      if (iVar8 < (int)dVar2) {
        iVar6 = iVar8;
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_b0,(long)(iVar6 - (int)uVar10),
                 (allocator_type *)&local_80);
      for (piVar4 = (int *)local_b0.west; piVar4 != (int *)local_b0.south; piVar4 = piVar4 + 1) {
        *piVar4 = (int)uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      iVar6 = TVar14.y + 1;
      dVar2 = ldexp(1.0,*zoom);
      if ((int)dVar2 <= iVar6) {
        iVar6 = (int)dVar2;
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&local_80,(long)(iVar6 - (int)uVar7),(allocator_type *)&local_8c);
      for (piVar5 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar5 != local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
        *piVar5 = (int)uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      local_58 = (int *)local_b0.south;
      piVar4 = (int *)local_b0.west;
      if (local_b0.west != local_b0.south) {
        do {
          piVar5 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start !=
              local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) {
            iVar6 = *piVar4;
            piVar11 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              local_8c.y = *piVar11;
              local_8c.z = *zoom;
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              local_8c.x = iVar6;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
                _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,__position,&local_8c);
              }
              else {
                (__position._M_current)->z = local_8c.z;
                (__position._M_current)->x = iVar6;
                (__position._M_current)->y = local_8c.y;
                ppTVar1 = &(__return_storage_ptr__->
                           super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
              piVar11 = piVar11 + 1;
            } while (piVar11 != piVar5);
          }
          piVar4 = piVar4 + 1;
        } while (piVar4 != local_58);
      }
      if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pLVar3 = local_60;
      if ((int *)local_b0.west != (int *)0x0) {
        operator_delete((void *)local_b0.west);
      }
      pLVar9 = pLVar3 + 1;
    } while (pLVar9 != local_68);
  }
  if (local_c8.
      super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
      _M_impl.super__Vector_impl_data._M_start != (LngLatBbox *)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tile> tiles(const LngLatBbox &llbbox, const int &zoom)
{
    vector<LngLatBbox> bboxes;
    if (llbbox.west > llbbox.east)
    {
        bboxes.push_back(LngLatBbox{-180.0, llbbox.south, llbbox.east, llbbox.north});
        bboxes.push_back(LngLatBbox{llbbox.west, llbbox.south, 180.0, llbbox.north});
    }
    else
    {
        bboxes.push_back(llbbox);
    }

    vector<Tile> return_tiles;
    for (auto bbox : bboxes)
    {
        double w = max(-180.0, bbox.west);
        double s = max(-85.051129, bbox.south);
        double e = min(180.0, bbox.east);
        double n = min(85.051129, bbox.north);

        Tile ll = tile(w, s, zoom);
        Tile ur = tile(e, n, zoom);

        // Clamp left x and top y at 0.
        int llx = (ll.x < 0) ? 0 : ll.x;
        int ury = (ur.y < 0) ? 0 : ur.y;

        std::vector<int> x(min(ur.x + 1, int(pow(2, zoom))) - llx);
        std::iota(std::begin(x), std::end(x), llx);
        std::vector<int> y(min(ll.y + 1, int(pow(2, zoom))) - ury);
        std::iota(std::begin(y), std::end(y), ury);

        for (auto i : x)
        {
            for (auto j : y)
            {
                return_tiles.push_back(Tile{i, j, zoom});
            }
        }
    }
    return return_tiles;
}